

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswConstr.c
# Opt level: O3

Aig_Obj_t * Ssw_ManSweepBmcConstr_rec(Ssw_Man_t *p,Aig_Obj_t *pObj,int f)

{
  Aig_Man_t *pAVar1;
  void *pvVar2;
  uint uVar3;
  Aig_Obj_t *pAVar4;
  ulong uVar5;
  Aig_Obj_t *p1;
  
  pAVar4 = p->pNodeToFrames[pObj->Id * p->nFrames + f];
  if (pAVar4 == (Aig_Obj_t *)0x0) {
    uVar3 = (uint)*(undefined8 *)&pObj->field_0x18;
    if ((uVar3 & 7) == 2) {
      pAVar1 = p->pAig;
      if ((pObj->field_0).CioId < pAVar1->nTruePis) {
        __assert_fail("!Saig_ObjIsPi(p->pAig, pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswConstr.c"
                      ,0x178,"Aig_Obj_t *Ssw_ManSweepBmcConstr_rec(Ssw_Man_t *, Aig_Obj_t *, int)");
      }
      if (f < 1) {
        __assert_fail("f > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswConstr.c"
                      ,0x17b,"Aig_Obj_t *Ssw_ManSweepBmcConstr_rec(Ssw_Man_t *, Aig_Obj_t *, int)");
      }
      uVar3 = ((pObj->field_0).CioId - pAVar1->nTruePis) + pAVar1->nTruePos;
      if (((int)uVar3 < 0) || (pAVar1->vCos->nSize <= (int)uVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar2 = pAVar1->vCos->pArray[uVar3];
      pAVar4 = Ssw_ManSweepBmcConstr_rec
                         (p,(Aig_Obj_t *)(*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe),f + -1)
      ;
      pAVar4 = (Aig_Obj_t *)((ulong)((uint)*(undefined8 *)((long)pvVar2 + 8) & 1) ^ (ulong)pAVar4);
    }
    else {
      if ((uVar3 & 7) - 7 < 0xfffffffe) {
        __assert_fail("Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswConstr.c"
                      ,0x182,"Aig_Obj_t *Ssw_ManSweepBmcConstr_rec(Ssw_Man_t *, Aig_Obj_t *, int)");
      }
      Ssw_ManSweepBmcConstr_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),f);
      Ssw_ManSweepBmcConstr_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),f);
      if (((ulong)pObj & 1) != 0) {
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswInt.h"
                      ,0xb9,"Aig_Obj_t *Ssw_ObjChild0Fra(Ssw_Man_t *, Aig_Obj_t *, int)");
      }
      uVar5 = (ulong)pObj->pFanin0 & 0xfffffffffffffffe;
      if (uVar5 == 0) {
        pAVar4 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar4 = (Aig_Obj_t *)
                 ((ulong)((uint)pObj->pFanin0 & 1) ^
                 (ulong)p->pNodeToFrames[*(int *)(uVar5 + 0x24) * p->nFrames + f]);
      }
      uVar5 = (ulong)pObj->pFanin1 & 0xfffffffffffffffe;
      if (uVar5 == 0) {
        p1 = (Aig_Obj_t *)0x0;
      }
      else {
        p1 = (Aig_Obj_t *)
             ((ulong)((uint)pObj->pFanin1 & 1) ^
             (ulong)p->pNodeToFrames[*(int *)(uVar5 + 0x24) * p->nFrames + f]);
      }
      pAVar4 = Aig_And(p->pFrames,pAVar4,p1);
    }
    p->pNodeToFrames[pObj->Id * p->nFrames + f] = pAVar4;
    if (pAVar4 == (Aig_Obj_t *)0x0) {
      __assert_fail("pObjNew != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswConstr.c"
                    ,0x188,"Aig_Obj_t *Ssw_ManSweepBmcConstr_rec(Ssw_Man_t *, Aig_Obj_t *, int)");
    }
  }
  return pAVar4;
}

Assistant:

Aig_Obj_t * Ssw_ManSweepBmcConstr_rec( Ssw_Man_t * p, Aig_Obj_t * pObj, int f )
{
    Aig_Obj_t * pObjNew, * pObjLi;
    pObjNew = Ssw_ObjFrame( p, pObj, f );
    if ( pObjNew )
        return pObjNew;
    assert( !Saig_ObjIsPi(p->pAig, pObj) );
    if ( Saig_ObjIsLo(p->pAig, pObj) )
    {
        assert( f > 0 );
        pObjLi  = Saig_ObjLoToLi( p->pAig, pObj );
        pObjNew = Ssw_ManSweepBmcConstr_rec( p, Aig_ObjFanin0(pObjLi), f-1 );
        pObjNew = Aig_NotCond( pObjNew, Aig_ObjFaninC0(pObjLi) );
    }
    else
    {
        assert( Aig_ObjIsNode(pObj) );
        Ssw_ManSweepBmcConstr_rec( p, Aig_ObjFanin0(pObj), f );
        Ssw_ManSweepBmcConstr_rec( p, Aig_ObjFanin1(pObj), f );
        pObjNew = Aig_And( p->pFrames, Ssw_ObjChild0Fra(p, pObj, f), Ssw_ObjChild1Fra(p, pObj, f) );
    }
    Ssw_ObjSetFrame( p, pObj, f, pObjNew );
    assert( pObjNew != NULL );
    return pObjNew;
}